

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O2

int __thiscall
Layer_c_api::forward_inplace
          (Layer_c_api *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs,
          Option *opt)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  allocator_type local_41;
  vector<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_> bottom_top_blobs0;
  
  uVar2 = ((long)(bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                _M_impl.super__Vector_impl_data._M_start) / 0x48;
  iVar1 = (int)uVar2;
  std::vector<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_>::vector
            (&bottom_top_blobs0,(long)iVar1,&local_41);
  lVar3 = 0;
  uVar4 = 0;
  if (0 < iVar1) {
    uVar4 = uVar2 & 0xffffffff;
  }
  for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    bottom_top_blobs0.super__Vector_base<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_>._M_impl.
    super__Vector_impl_data._M_start[uVar2] =
         (__ncnn_mat_t *)
         ((long)&((bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                  _M_impl.super__Vector_impl_data._M_start)->data + lVar3);
    lVar3 = lVar3 + 0x48;
  }
  iVar1 = (*this->layer->forward_inplace_n)
                    (this->layer,
                     bottom_top_blobs0.
                     super__Vector_base<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_>._M_impl.
                     super__Vector_impl_data._M_start,iVar1,(ncnn_option_t)opt);
  std::_Vector_base<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_>::~_Vector_base
            (&bottom_top_blobs0.super__Vector_base<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_>)
  ;
  return iVar1;
}

Assistant:

virtual int forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
    {
        const int n = bottom_top_blobs.size();
        std::vector<ncnn_mat_t> bottom_top_blobs0(n);
        for (int i = 0; i < n; i++)
        {
            bottom_top_blobs0[i] = (ncnn_mat_t)&bottom_top_blobs[i];
        }
        return layer->forward_inplace_n(layer, bottom_top_blobs0.data(), n, (ncnn_option_t)&opt);
    }